

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  Select *pSVar1;
  int iVar2;
  Expr *pEVar3;
  undefined1 local_88 [8];
  Expr t;
  Expr *pWhere;
  Expr *pNew;
  sqlite3 *db;
  Select *pS;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (pExpr->op == ',') {
    pWalker_local._4_4_ = 0;
  }
  else {
    pSVar1 = (pWalker->u).pSelect;
    iVar2 = sqlite3ExprIsConstantOrGroupBy(pWalker->pParse,pExpr,pSVar1->pGroupBy);
    if ((((iVar2 != 0) && ((pExpr->flags & 0x20000001) != 0x20000000)) &&
        (pExpr->pAggInfo == (AggInfo *)0x0)) &&
       (pEVar3 = sqlite3Expr(pWalker->pParse->db,0x9b,"1"), pEVar3 != (Expr *)0x0)) {
      t.y = (anon_union_8_3_c79b3df9_for_y)pSVar1->pWhere;
      memcpy(local_88,pEVar3,0x48);
      memcpy(pEVar3,pExpr,0x48);
      memcpy(pExpr,local_88,0x48);
      pEVar3 = sqlite3ExprAnd(pWalker->pParse,(Expr *)t.y.pTab,pEVar3);
      pSVar1->pWhere = pEVar3;
      pWalker->eCode = 1;
    }
    pWalker_local._4_4_ = 1;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    /* This routine is called before the HAVING clause of the current
    ** SELECT is analyzed for aggregates. So if pExpr->pAggInfo is set
    ** here, it indicates that the expression is a correlated reference to a
    ** column from an outer aggregate query, or an aggregate function that
    ** belongs to an outer query. Do not move the expression to the WHERE
    ** clause in this obscure case, as doing so may corrupt the outer Select
    ** statements AggInfo structure.  */
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy)
     && ExprAlwaysFalse(pExpr)==0
     && pExpr->pAggInfo==0
    ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3Expr(db, TK_INTEGER, "1");
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(pWalker->pParse, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}